

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

Vec_Int_t * Abc_SclExtractBarBufs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Mio_Gate_t *pMVar2;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pObj;
  int *__ptr;
  int i;
  uint uVar4;
  
  pMVar2 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
  if (pMVar2 == (Mio_Gate_t *)0x0) {
    puts("Cannot find buffer in the current library. Quitting.");
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = Vec_IntAlloc(100);
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pObj = Abc_NtkObj(pNtk,i);
      if (pObj != (Abc_Obj_t *)0x0) {
        iVar1 = Abc_ObjIsBarBuf(pObj);
        if (iVar1 != 0) {
          if ((pObj->field_5).pData != (void *)0x0) {
            __assert_fail("pObj->pData == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                          ,0x12d,"Vec_Int_t *Abc_SclExtractBarBufs(Abc_Ntk_t *)");
          }
          (pObj->field_5).pData = pMVar2;
          iVar1 = pVVar3->nSize;
          if (iVar1 == pVVar3->nCap) {
            uVar4 = iVar1 * 2;
            if (iVar1 < 0x10) {
              uVar4 = 0x10;
            }
            __ptr = pVVar3->pArray;
            if (iVar1 < (int)uVar4) {
              if (__ptr == (int *)0x0) {
                __ptr = (int *)malloc((ulong)uVar4 << 2);
              }
              else {
                __ptr = (int *)realloc(__ptr,(ulong)uVar4 << 2);
              }
              pVVar3->pArray = __ptr;
              if (__ptr == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar3->nCap = uVar4;
            }
          }
          else {
            __ptr = pVVar3->pArray;
          }
          pVVar3->nSize = iVar1 + 1;
          __ptr[iVar1] = i;
        }
      }
    }
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_SclExtractBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vBufs;
    Mio_Gate_t * pBuffer;
    Abc_Obj_t * pObj; int i;
    pBuffer = Mio_LibraryReadBuf( (Mio_Library_t *)pNtk->pManFunc );
    if ( pBuffer == NULL )
    {
        printf( "Cannot find buffer in the current library. Quitting.\n" );
        return NULL;
    }
    vBufs = Vec_IntAlloc( 100 );
    Abc_NtkForEachBarBuf( pNtk, pObj, i )
    {
        assert( pObj->pData == NULL );
        pObj->pData = pBuffer;
        Vec_IntPush( vBufs, i );
    }
    return vBufs;
}